

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void initGlobalPermute(void)

{
  int iVar1;
  int v;
  int local_4;
  
  if (booleanOptions[2] == 0) {
    globalPermute = getIdentityFromZero(v);
  }
  else {
    globalPermute = getRandomFromOne(v);
    for (local_4 = 1; local_4 <= numOfVariables; local_4 = local_4 + 1) {
      iVar1 = myrand();
      if (iVar1 % 2 == 1) {
        globalPermute[local_4] = -globalPermute[local_4];
      }
    }
  }
  return;
}

Assistant:

void initGlobalPermute()
{
    int v;

    if (booleanOptions[REORDER])
    {
        globalPermute = getRandomFromOne (numOfVariables);
        for (v=1;v<=numOfVariables;v++)
            if (myrand() % 2 ==1 )
                globalPermute[v] = -globalPermute[v];
    }
    else
        globalPermute = getIdentityFromZero (numOfVariables+1);

}